

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ForkBranch<kj::_::Void,_true>::get
          (ForkBranch<kj::_::Void,_true> *this,ExceptionOrValue *output)

{
  bool bVar1;
  ExceptionOrValue *pEVar2;
  bool bVar3;
  
  pEVar2 = ((this->super_ForkBranchBase).hub.ptr)->resultRef;
  bVar1 = output[1].exception.ptr.isSet;
  if (pEVar2[1].exception.ptr.isSet == true) {
    bVar3 = true;
    if (bVar1 != false) {
      output[1].exception.ptr.isSet = false;
    }
  }
  else {
    if (bVar1 == false) goto LAB_0022cda0;
    bVar3 = false;
  }
  output[1].exception.ptr.isSet = bVar3;
LAB_0022cda0:
  if (pEVar2 != output) {
    if ((output->exception).ptr.isSet == true) {
      (output->exception).ptr.isSet = false;
      Exception::~Exception(&(output->exception).ptr.field_1.value);
    }
    if ((pEVar2->exception).ptr.isSet == true) {
      Exception::Exception
                (&(output->exception).ptr.field_1.value,&(pEVar2->exception).ptr.field_1.value);
      (output->exception).ptr.isSet = true;
    }
  }
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_SOME(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(value);
    } else {
      output.as<T>().value = kj::none;
    }